

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_ldrddi.cpp
# Opt level: O0

ze_result_t loader::zesFanGetProperties(zes_fan_handle_t hFan,zes_fan_properties_t *pProperties)

{
  zes_pfnFanGetProperties_t pfnGetProperties;
  dditable_t *dditable;
  ze_result_t result;
  zes_fan_properties_t *pProperties_local;
  zes_fan_handle_t hFan_local;
  
  if (*(code **)(*(long *)(hFan + 8) + 0xc48) == (code *)0x0) {
    hFan_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
  }
  else {
    hFan_local._4_4_ = (**(code **)(*(long *)(hFan + 8) + 0xc48))(*(undefined8 *)hFan,pProperties);
  }
  return hFan_local._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zesFanGetProperties(
        zes_fan_handle_t hFan,                          ///< [in] Handle for the component.
        zes_fan_properties_t* pProperties               ///< [in,out] Will contain the properties of the fan.
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // extract driver's function pointer table
        auto dditable = reinterpret_cast<zes_fan_object_t*>( hFan )->dditable;
        auto pfnGetProperties = dditable->zes.Fan.pfnGetProperties;
        if( nullptr == pfnGetProperties )
            return ZE_RESULT_ERROR_UNINITIALIZED;

        // convert loader handle to driver handle
        hFan = reinterpret_cast<zes_fan_object_t*>( hFan )->handle;

        // forward to device-driver
        result = pfnGetProperties( hFan, pProperties );

        return result;
    }